

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

string * tinyusdz::anon_unknown_160::GetExtension(string *__return_storage_ptr__,string *name)

{
  string local_30;
  
  io::GetFileExtension(&local_30,name);
  to_lower(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtension(const std::string &name) {
  return to_lower(io::GetFileExtension(name));
}